

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness.cpp
# Opt level: O1

uint32_t __thiscall
spvtools::opt::analysis::LivenessManager::AnalyzeAccessChainLoc
          (LivenessManager *this,Instruction *ac,uint32_t curr_type_id,uint32_t *offset,bool *no_loc
          ,bool is_patch,bool input)

{
  IRContext *pIVar1;
  DefUseManager *pDVar2;
  DecorationManager *pDVar3;
  pointer pOVar4;
  uint **ppuVar5;
  char cVar6;
  ExecutionModel EVar7;
  uint **ppuVar8;
  bool bVar9;
  pointer pOVar10;
  uint32_t ocnt;
  uint32_t local_7c;
  undefined8 *local_78;
  undefined8 uStack_70;
  code *local_68;
  code *pcStack_60;
  uint32_t *local_50;
  bool *local_48;
  uint *local_40;
  undefined4 local_34;
  
  pIVar1 = this->ctx_;
  local_7c = curr_type_id;
  local_50 = offset;
  local_48 = no_loc;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
  }
  pDVar2 = (pIVar1->def_use_mgr_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
           .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  pIVar1 = this->ctx_;
  if ((pIVar1->valid_analyses_ & kAnalysisDecorations) == kAnalysisNone) {
    IRContext::BuildDecorationManager(pIVar1);
  }
  pDVar3 = (pIVar1->decoration_mgr_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
           .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>._M_head_impl;
  EVar7 = IRContext::GetStage(this->ctx_);
  bVar9 = EVar7 - ExecutionModelTessellationControl < 3;
  if (!input) {
    bVar9 = EVar7 == ExecutionModelTessellationControl;
  }
  local_34 = 0;
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78 = (undefined8 *)0x0;
  uStack_70 = 0;
  local_78 = (undefined8 *)operator_new(0x40);
  *local_78 = this;
  local_78[1] = &local_34;
  local_78[2] = pDVar2;
  local_78[3] = pDVar3;
  local_78[4] = &local_7c;
  local_78[5] = local_50;
  local_78[6] = local_48;
  *(char *)(local_78 + 7) = !is_patch & bVar9;
  pcStack_60 = std::
               _Function_handler<bool_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/liveness.cpp:188:26)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<bool_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/liveness.cpp:188:26)>
             ::_M_manager;
  pOVar10 = (ac->operands_).
            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pOVar4 = (ac->operands_).
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pOVar10 != pOVar4) {
    do {
      if ((pOVar10->type & ~SPV_OPERAND_TYPE_ID) != SPV_OPERAND_TYPE_TYPE_ID) {
        ppuVar5 = (uint **)(pOVar10->words).large_data_._M_t.
                           super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           .
                           super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                           ._M_head_impl;
        ppuVar8 = &(pOVar10->words).small_data_;
        if (ppuVar5 != (uint **)0x0) {
          ppuVar8 = ppuVar5;
        }
        local_40 = *ppuVar8;
        if (local_68 == (code *)0x0) {
          std::__throw_bad_function_call();
        }
        cVar6 = (*pcStack_60)(&local_78,&local_40);
        if (cVar6 == '\0') break;
      }
      pOVar10 = pOVar10 + 1;
    } while (pOVar10 != pOVar4);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,3);
  }
  return local_7c;
}

Assistant:

uint32_t LivenessManager::AnalyzeAccessChainLoc(const Instruction* ac,
                                                uint32_t curr_type_id,
                                                uint32_t* offset, bool* no_loc,
                                                bool is_patch, bool input) {
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  analysis::DecorationManager* deco_mgr = context()->get_decoration_mgr();
  // For tesc, tese and geom input variables, and tesc output variables,
  // first array index does not contribute to offset.
  auto stage = context()->GetStage();
  bool skip_first_index = false;
  if ((input && (stage == spv::ExecutionModel::TessellationControl ||
                 stage == spv::ExecutionModel::TessellationEvaluation ||
                 stage == spv::ExecutionModel::Geometry)) ||
      (!input && stage == spv::ExecutionModel::TessellationControl))
    skip_first_index = !is_patch;
  uint32_t ocnt = 0;
  ac->WhileEachInOperand([this, &ocnt, def_use_mgr, deco_mgr, &curr_type_id,
                          offset, no_loc,
                          skip_first_index](const uint32_t* opnd) {
    if (ocnt >= 1) {
      // Skip first index's contribution to offset if indicated
      Instruction* curr_type_inst = def_use_mgr->GetDef(curr_type_id);
      if (ocnt == 1 && skip_first_index) {
        assert(curr_type_inst->opcode() == spv::Op::OpTypeArray &&
               "unexpected wrapper type");
        const uint32_t kArrayElementTypeInIdx = 0;
        curr_type_id =
            curr_type_inst->GetSingleWordInOperand(kArrayElementTypeInIdx);
        ocnt++;
        return true;
      }
      // If any non-constant index, mark the entire current object and return.
      auto idx_inst = def_use_mgr->GetDef(*opnd);
      if (idx_inst->opcode() != spv::Op::OpConstant) return false;
      // If current type is struct, look for location decoration on member and
      // reset offset if found.
      auto index = idx_inst->GetSingleWordInOperand(0);
      if (curr_type_inst->opcode() == spv::Op::OpTypeStruct) {
        uint32_t loc = 0;
        bool no_mem_loc = deco_mgr->WhileEachDecoration(
            curr_type_id, uint32_t(spv::Decoration::Location),
            [&loc, index, no_loc](const Instruction& deco) {
              assert(deco.opcode() == spv::Op::OpMemberDecorate &&
                     "unexpected decoration");
              if (deco.GetSingleWordInOperand(kOpDecorateMemberMemberInIdx) ==
                  index) {
                loc =
                    deco.GetSingleWordInOperand(kOpDecorateMemberLocationInIdx);
                *no_loc = false;
                return false;
              }
              return true;
            });
        if (!no_mem_loc) {
          *offset = loc;
          curr_type_id = curr_type_inst->GetSingleWordInOperand(index);
          ocnt++;
          return true;
        }
      }

      // Update offset and current type based on constant index.
      *offset += GetLocOffset(index, curr_type_id);
      curr_type_id = GetComponentType(index, curr_type_id);
    }
    ocnt++;
    return true;
  });
  return curr_type_id;
}